

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int remove_ext_list(nifti_image *nim,char **elist,int len)

{
  int iVar1;
  uint uVar2;
  void *__ptr;
  nifti1_extension *pnVar3;
  nifti1_extension *pnVar4;
  uint local_38;
  int extval;
  int ec;
  int c;
  int *marks;
  int len_local;
  char **elist_local;
  nifti_image *nim_local;
  
  if (nim->num_ext < len) {
    fprintf(_stderr,"** cannot remove %d exts from image \'%s\' with only %d\n",(ulong)(uint)len,
            nim->fname,(ulong)(uint)nim->num_ext);
    nim_local._4_4_ = -1;
  }
  else if (len < 1) {
    fprintf(_stderr,"** REL: (%d) no extensions to remove?\n",(ulong)(uint)len);
    nim_local._4_4_ = -1;
  }
  else {
    iVar1 = atoi(*elist);
    if (iVar1 == -1) {
      if (1 < g_debug) {
        fprintf(_stderr,"+d removing ALL (%d) extensions from \'%s\'\n",(ulong)(uint)nim->num_ext,
                nim->fname);
      }
      nifti_free_extensions(nim);
      nim_local._4_4_ = 0;
    }
    else {
      if (2 < g_debug) {
        fprintf(_stderr,"+d removing %d exts from \'%s\'\n",(ulong)(uint)len,nim->fname);
      }
      __ptr = calloc((long)nim->num_ext,4);
      if (__ptr == (void *)0x0) {
        fprintf(_stderr,"** failed to alloc %d marks\n",(ulong)(uint)nim->num_ext);
        nim_local._4_4_ = -1;
      }
      else {
        for (local_38 = 0; (int)local_38 < len; local_38 = local_38 + 1) {
          uVar2 = atoi(elist[(int)local_38]);
          if (((int)uVar2 < 0) || (nim->num_ext <= (int)uVar2)) {
            fprintf(_stderr,"** ext #%d (= %d) is out of range [0,%d] for %s\n",(ulong)local_38,
                    (ulong)uVar2,(ulong)(nim->num_ext - 1),nim->fname);
            free(__ptr);
            return -1;
          }
          if (*(int *)((long)__ptr + (long)(int)uVar2 * 4) != 0) {
            fprintf(_stderr,"** ext #%d (= %d) is a duplicate",(ulong)local_38,(ulong)uVar2);
            free(__ptr);
            return -1;
          }
          *(int *)((long)__ptr + (long)(int)uVar2 * 4) =
               *(int *)((long)__ptr + (long)(int)uVar2 * 4) + 1;
        }
        uVar2 = nim->num_ext;
        while (extval = uVar2, local_38 = extval + -1, -1 < (int)local_38) {
          uVar2 = local_38;
          if (*(int *)((long)__ptr + (long)(int)local_38 * 4) != 0) {
            if (2 < g_debug) {
              disp_nifti1_extension("+d removing ext: ",nim->ext_list + (int)local_38,-1);
            }
            if (nim->ext_list[(int)local_38].edata != (char *)0x0) {
              free(nim->ext_list[(int)local_38].edata);
            }
            for (; extval < nim->num_ext; extval = extval + 1) {
              pnVar3 = nim->ext_list + (extval + -1);
              pnVar4 = nim->ext_list + extval;
              iVar1 = pnVar4->ecode;
              pnVar3->esize = pnVar4->esize;
              pnVar3->ecode = iVar1;
              pnVar3->edata = pnVar4->edata;
            }
            nim->num_ext = nim->num_ext + -1;
            uVar2 = local_38;
          }
        }
        if (3 < g_debug) {
          fprintf(_stderr,"-d done removing extensions\n");
        }
        if (nim->num_ext == 0) {
          if (1 < g_debug) {
            fprintf(_stderr,"-d removed ALL extensions from %s\n",nim->fname);
          }
          free(nim->ext_list);
          nim->ext_list = (nifti1_extension *)0x0;
        }
        free(__ptr);
        nim_local._4_4_ = 0;
      }
    }
  }
  return nim_local._4_4_;
}

Assistant:

int remove_ext_list( nifti_image * nim, char ** elist, int len )
{
   int * marks;
   int   c, ec, extval;

   if( len > nim->num_ext ){
      fprintf(stderr, "** cannot remove %d exts from image '%s' with only %d\n",
              len, nim->fname, nim->num_ext);
      return -1;
   }

   if( len <= 0 ){
      fprintf(stderr,"** REL: (%d) no extensions to remove?\n",len);
      return -1;
   }

   extval = atoi(elist[0]);  /* check the first value */

   /* first special case, elist[0] == -1 */
   if( extval == -1 )
   {
      if( g_debug > 1 )
          fprintf(stderr,"+d removing ALL (%d) extensions from '%s'\n",
                  nim->num_ext, nim->fname );
      nifti_free_extensions(nim);
      return 0;
   }

   if( g_debug > 2 )
      fprintf(stderr,"+d removing %d exts from '%s'\n", len, nim->fname );

   if( ! (marks = (int *)calloc(nim->num_ext, sizeof(int))) ) {
      fprintf(stderr,"** failed to alloc %d marks\n",nim->num_ext);
      return -1;
   }

   /* mark all extensions for removal */
   for( ec = 0; ec < len; ec++ )
   {
      extval = atoi(elist[ec]);

      if( extval < 0 || extval >= nim->num_ext ){
         fprintf(stderr,"** ext #%d (= %d) is out of range [0,%d] for %s\n",
                 ec, extval, nim->num_ext-1, nim->fname);
         free(marks); return -1;
      }

      if( marks[extval] ){
         fprintf(stderr,"** ext #%d (= %d) is a duplicate", ec, extval);
         free(marks); return -1;
      }

      marks[extval]++;
   }

   /* now remove them - count from top down to do lazy programming */
   for( ec = nim->num_ext-1; ec >= 0; ec-- )
   {
      if( !marks[ec] ) continue;   /* do not delete this one */

      if( g_debug > 2 )
         disp_nifti1_extension("+d removing ext: ",nim->ext_list+ec,-1);

      /* delete this data, and shift the list down (yeah, inefficient) */
      if( nim->ext_list[ec].edata ) free( nim->ext_list[ec].edata );

      /* move anything above down one */
      for( c = ec+1; c < nim->num_ext; c++ )
         nim->ext_list[c-1] = nim->ext_list[c];

      nim->num_ext--;
   }

   if( g_debug > 3 ) fprintf(stderr,"-d done removing extensions\n");

   if( nim->num_ext == 0 ){  /* did we trash the only extension? */
      if( g_debug > 1 )
         fprintf(stderr,"-d removed ALL extensions from %s\n",nim->fname);
      free(nim->ext_list);
      nim->ext_list = NULL;
   }

   free(marks);
   return 0;
}